

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v10::detail::write_codepoint<2ul,char,fmt::v10::appender>
                   (appender out,char prefix,uint32_t cp)

{
  long lVar1;
  bool bVar2;
  char *pcVar3;
  char buf [2];
  char local_1a [2];
  
  if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                0x18) <
      *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
               0x10) + 1U) {
    (*(code *)**(undefined8 **)
                out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
              (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
  }
  lVar1 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
                   + 0x10);
  *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container + 0x10)
       = lVar1 + 1;
  *(undefined1 *)
   (*(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container + 8) +
   lVar1) = 0x5c;
  if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
                0x18) <
      *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container +
               0x10) + 1U) {
    (*(code *)**(undefined8 **)
                out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container)
              (out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
  }
  lVar1 = *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container
                   + 0x10);
  *(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container + 0x10)
       = lVar1 + 1;
  *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
                            container + 8) + lVar1) = prefix;
  local_1a[0] = '0';
  local_1a[1] = '0';
  pcVar3 = local_1a + 1;
  do {
    *pcVar3 = "0123456789abcdef"[cp & 0xf];
    pcVar3 = pcVar3 + -1;
    bVar2 = 0xf < cp;
    cp = cp >> 4;
  } while (bVar2);
  buffer<char>::append<char>
            ((buffer<char> *)
             out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container,local_1a,
             &stack0xffffffffffffffe8);
  return (appender)
         out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
}

Assistant:

auto write_codepoint(OutputIt out, char prefix, uint32_t cp) -> OutputIt {
  *out++ = static_cast<Char>('\\');
  *out++ = static_cast<Char>(prefix);
  Char buf[width];
  fill_n(buf, width, static_cast<Char>('0'));
  format_uint<4>(buf, cp, width);
  return copy_str<Char>(buf, buf + width, out);
}